

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O1

Generation * Generation::create(string *path,int umask,bool isToken)

{
  pointer pcVar1;
  Generation *this;
  string local_48;
  
  this = (Generation *)operator_new(0x40);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + path->_M_string_length);
  Generation(this,&local_48,umask,isToken);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((isToken) && (this->genMutex == (Mutex *)0x0)) {
    (*this->_vptr_Generation[1])(this);
    this = (Generation *)0x0;
  }
  return this;
}

Assistant:

Generation* Generation::create(const std::string path, int umask, bool isToken)
{
	Generation* gen = new Generation(path, umask, isToken);
	if ((gen != NULL) && isToken && (gen->genMutex == NULL))
	{
		delete gen;

		return NULL;
	}
	return gen;
}